

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O3

void XmlReporter__will_report_beginning_and_successful_finishing_of_passing_test(void)

{
  char *pcVar1;
  undefined8 uVar2;
  size_t sVar3;
  va_list null_arguments;
  __va_list_tag local_48;
  
  local_48.gp_offset = 0;
  local_48.fp_offset = 0;
  local_48.overflow_arg_area = (void *)0x0;
  local_48.reg_save_area = (void *)0x0;
  (*reporter->start_test)(reporter,"test_name");
  pcVar1 = output;
  uVar2 = create_begins_with_string_constraint
                    ("<testcase classname=\"\"","\"<testcase classname=\\\"\\\"\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x68,"output",pcVar1,uVar2);
  pcVar1 = output;
  uVar2 = create_contains_string_constraint("name=\"test_name\"","\"name=\\\"test_name\\\"\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x69,"output",pcVar1,uVar2);
  clear_output();
  (*reporter->show_pass)(reporter,"file",2,"test_name",&local_48);
  sVar3 = strlen(output);
  uVar2 = create_equal_to_value_constraint(0,"0");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x6e,"strlen(output)",sVar3,uVar2);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar1 = output;
  uVar2 = create_contains_string_constraint("</testcase>","\"</testcase>\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x71,"output",pcVar1,uVar2);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}